

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,string *filename,bool noPolicyScope)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider filename_00;
  bool bVar2;
  bool bVar3;
  string *psVar4;
  cmMessenger *messenger;
  pointer value;
  string filenametoread;
  cmListFile listFile;
  IncludeScope incScope;
  string local_88;
  undefined1 local_68 [48];
  IncludeScope local_38;
  
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"CMAKE_PARENT_LIST_FILE","");
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_CURRENT_LIST_FILE","");
  psVar4 = GetDef(this,&local_88);
  if (psVar4 == (string *)0x0) {
    value = (char *)0x0;
  }
  else {
    value = (psVar4->_M_dataplus)._M_p;
  }
  AddDefinition(this,(string *)local_68,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_68,&this->StateSnapshot);
  psVar4 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_68);
  cmsys::SystemTools::CollapseFullPath(&local_88,filename,psVar4);
  IncludeScope::IncludeScope(&local_38,this,&local_88,noPolicyScope);
  filename_00._M_p = local_88._M_dataplus._M_p;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_68._16_8_ = 0;
  messenger = cmake::GetMessenger(this->GlobalGenerator->CMakeInstance);
  bVar2 = cmListFile::ParseFile((cmListFile *)local_68,filename_00._M_p,messenger,&this->Backtrace);
  if (bVar2) {
    ReadListFile(this,(cmListFile *)local_68,&local_88);
    if (cmSystemTools::s_FatalErrorOccured == false) {
      bVar3 = cmSystemTools::GetInterruptFlag();
      if (!bVar3) goto LAB_001c2e6d;
    }
    local_38.ReportError = false;
  }
LAB_001c2e6d:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_68);
  IncludeScope::~IncludeScope(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmMakefile::ReadDependentFile(const std::string& filename,
                                   bool noPolicyScope)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE",
                      this->GetDefinition("CMAKE_CURRENT_LIST_FILE"));
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    incScope.Quiet();
  }
  return true;
}